

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.cpp
# Opt level: O0

void __thiscall NaPNFill::post_action(NaPNFill *this)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NaPetriNode *in_RDI;
  
  uVar1 = NaPetriNode::activations(in_RDI);
  if (*(uint *)&in_RDI[5].pcaPorts.pHead < uVar1) {
    NaPetriCnInput::commit_data((NaPetriCnInput *)in_RDI);
  }
  NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x176ea4);
  uVar1 = NaPetriNode::activations(in_RDI);
  if (*(uint *)&in_RDI[5].pcaPorts.pHead < uVar1) {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var,iVar2) = 0x3ff0000000000000;
  }
  else {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var_00,iVar2) = 0xbff0000000000000;
  }
  NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x176f1e);
  return;
}

Assistant:

void
NaPNFill::post_action ()
{
  // <= due to activations() already ++
  if(activations() > nFill){
    // Case of simple transfer
    
    // Commit input to get next data portion
    in.commit_data();
  }

  // Case of filling and simple transfer
  out.commit_data();

  if(activations() > nFill)
    sync.data()[0] = 1;
  else
    sync.data()[0] = -1;

  // Commit synchronization
  sync.commit_data();
}